

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

TranslationBlock_conflict *
tb_gen_code_mipsel(CPUState *cpu,target_ulong_conflict pc,target_ulong_conflict cs_base,
                  uint32_t flags,int cflags)

{
  TCGContext_conflict6 *s;
  CPUArchState_conflict8 *env_00;
  void *pvVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  tb_page_addr_t phys_pc_00;
  CPUState *pCVar6;
  uint32_t uVar7;
  uintptr_t orig_aligned;
  int max_insns;
  int search_size;
  int gen_code_size;
  tcg_insn_unit *gen_code_buf;
  tb_page_addr_t tStack_58;
  target_ulong_conflict virt_page2;
  tb_page_addr_t phys_page2;
  tb_page_addr_t phys_pc;
  TranslationBlock_conflict *existing_tb;
  TranslationBlock_conflict *tb;
  CPUArchState_conflict8 *env;
  TCGContext_conflict4 *tcg_ctx;
  int cflags_local;
  uint32_t flags_local;
  target_ulong_conflict cs_base_local;
  target_ulong_conflict pc_local;
  CPUState *cpu_local;
  
  s = cpu->uc->tcg_ctx;
  env_00 = (CPUArchState_conflict8 *)cpu->env_ptr;
  phys_pc_00 = get_page_addr_code_mipsel(env_00,pc);
  tcg_ctx._0_4_ = cflags;
  if (phys_pc_00 == 0xffffffffffffffff) {
    tcg_ctx._0_4_ = cflags | 0x10000;
  }
  uVar2 = cpu->cluster_index << 0x18 | (uint)tcg_ctx & 0xffffff;
  orig_aligned._4_4_ = (uint)tcg_ctx & 0x7fff;
  if (orig_aligned._4_4_ == 0) {
    orig_aligned._4_4_ = 0x7fff;
  }
  if (0x200 < orig_aligned._4_4_) {
    orig_aligned._4_4_ = 0x200;
  }
  if (cpu->singlestep_enabled != 0) {
    orig_aligned._4_4_ = 1;
  }
LAB_00a601bc:
  do {
    cpu_local = (CPUState *)tcg_tb_alloc_mipsel((TCGContext_conflict4 *)s);
    if (cpu_local == (CPUState *)0x0) {
      tb_flush_mipsel(cpu);
      mmap_unlock();
      cpu->exception_index = 0x10000;
      cpu_loop_exit_mipsel(cpu);
    }
    pvVar1 = s->code_gen_ptr;
    ((tb_tc *)&cpu_local->cflags_next_tb)->ptr = pvVar1;
    cpu_local->nr_cores = pc;
    cpu_local->nr_threads = cs_base;
    *(uint32_t *)&cpu_local->thread = flags;
    cpu_local->created = (_Bool)(char)uVar2;
    cpu_local->stop = (_Bool)(char)(uVar2 >> 8);
    cpu_local->stopped = (_Bool)(char)(uVar2 >> 0x10);
    cpu_local->unplug = (_Bool)(char)(uVar2 >> 0x18);
    cpu_local->icount_budget = 0;
    uVar7 = (uint32_t)cpu->trace_dstate[0];
    cpu_local->crash_occurred = (_Bool)(char)uVar7;
    cpu_local->exit_request = (_Bool)(char)(uVar7 >> 8);
    cpu_local->in_exclusive_context = (_Bool)(char)(uVar7 >> 0x10);
    cpu_local->field_0x17 = (char)(uVar7 >> 0x18);
    s->tb_cflags = uVar2;
    while( true ) {
      tcg_func_start_mipsel((TCGContext_conflict4 *)s);
      pCVar6 = env_cpu(env_00);
      s->cpu = pCVar6;
      gen_intermediate_code_mipsel(cpu,(TranslationBlock_conflict *)cpu_local,orig_aligned._4_4_);
      s->cpu = (CPUState *)0x0;
      *(uint16_t *)(cpu_local->jmp_env[0].__jmpbuf + 2) = 0xffff;
      *(uint16_t *)((long)cpu_local->jmp_env[0].__jmpbuf + 0x12) = 0xffff;
      s->tb_jmp_reset_offset = (uint16_t *)(cpu_local->jmp_env[0].__jmpbuf + 2);
      s->tb_jmp_insn_offset = (uintptr_t *)(cpu_local->jmp_env[0].__jmpbuf + 3);
      s->tb_jmp_target_addr = (uintptr_t *)0x0;
      iVar3 = tcg_gen_code_mipsel((TCGContext_conflict4 *)s,(TranslationBlock_conflict *)cpu_local);
      if (-1 < iVar3) break;
      if (iVar3 != -2) {
        if (iVar3 != -1) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                     ,0x711,(char *)0x0);
        }
        goto LAB_00a601bc;
      }
      uVar4 = (uint)*(uint16_t *)((long)&cpu_local->thread + 6);
      if (uVar4 < 2) {
        __assert_fail("max_insns > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x70c,
                      "TranslationBlock *tb_gen_code_mipsel(CPUState *, target_ulong, target_ulong, uint32_t, int)"
                     );
      }
      orig_aligned._4_4_ = uVar4 / 2;
    }
    iVar5 = encode_search((uc_struct_conflict5 *)cpu->uc,(TranslationBlock_conflict *)cpu_local,
                          (uint8_t *)((long)pvVar1 + (long)iVar3));
    if (-1 < iVar5) {
      *(long *)&cpu_local->singlestep_enabled = (long)iVar3;
      s->code_gen_ptr =
           (void *)((long)pvVar1 + (long)iVar5 + (long)iVar3 + 0xf & 0xfffffffffffffff0);
      cpu_local->jmp_env[0].__jmpbuf[5] = 0;
      cpu_local->jmp_env[0].__jmpbuf[6] = 0;
      cpu_local->jmp_env[0].__jmpbuf[7] = 0;
      *(uintptr_t *)&cpu_local->jmp_env[0].__mask_was_saved = 0;
      cpu_local->jmp_env[0].__saved_mask.__val[0] = 0;
      if (*(uint16_t *)(cpu_local->jmp_env[0].__jmpbuf + 2) != 0xffff) {
        tb_reset_jump((TranslationBlock_conflict *)cpu_local,0);
      }
      if (*(uint16_t *)((long)cpu_local->jmp_env[0].__jmpbuf + 0x12) != 0xffff) {
        tb_reset_jump((TranslationBlock_conflict *)cpu_local,1);
      }
      uVar2 = (pc + *(uint16_t *)((long)&cpu_local->thread + 4)) - 1 & 0xfffff000;
      tStack_58 = 0xffffffffffffffff;
      if ((pc & 0xfffff000) != uVar2) {
        tStack_58 = get_page_addr_code_mipsel(env_00,uVar2);
      }
      pCVar6 = (CPUState *)
               tb_link_page((uc_struct_conflict5 *)cpu->uc,(TranslationBlock_conflict *)cpu_local,
                            phys_pc_00,tStack_58);
      if (pCVar6 == cpu_local) {
        tcg_tb_insert_mipsel((TCGContext_conflict4 *)s,(TranslationBlock_conflict *)cpu_local);
      }
      else {
        s->code_gen_ptr =
             (void *)((long)pvVar1 -
                     ((long)((uc_struct_conflict5 *)s->gen_insn_data[0x107][2])->
                            qemu_icache_linesize + 0x97U &
                     -(long)((uc_struct_conflict5 *)s->gen_insn_data[0x107][2])->
                            qemu_icache_linesize));
        cpu_local = pCVar6;
      }
      return (TranslationBlock_conflict *)cpu_local;
    }
  } while( true );
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}